

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool cJSON_ReplaceItemViaPointer(cJSON *parent,cJSON *item,cJSON *replacement)

{
  cJSON *replacement_local;
  cJSON *item_local;
  cJSON *parent_local;
  
  if (((parent == (cJSON *)0x0) || (replacement == (cJSON *)0x0)) || (item == (cJSON *)0x0)) {
    parent_local._4_4_ = 0;
  }
  else if (replacement == item) {
    parent_local._4_4_ = 1;
  }
  else {
    replacement->next = item->next;
    replacement->prev = item->prev;
    if (replacement->next != (cJSON *)0x0) {
      replacement->next->prev = replacement;
    }
    if (replacement->prev != (cJSON *)0x0) {
      replacement->prev->next = replacement;
    }
    if (parent->child == item) {
      parent->child = replacement;
    }
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    cJSON_Delete(item);
    parent_local._4_4_ = 1;
  }
  return parent_local._4_4_;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_ReplaceItemViaPointer(cJSON * const parent, cJSON * const item, cJSON * replacement)
{
    if ((parent == NULL) || (replacement == NULL) || (item == NULL))
    {
        return false;
    }

    if (replacement == item)
    {
        return true;
    }

    replacement->next = item->next;
    replacement->prev = item->prev;

    if (replacement->next != NULL)
    {
        replacement->next->prev = replacement;
    }
    if (replacement->prev != NULL)
    {
        replacement->prev->next = replacement;
    }
    if (parent->child == item)
    {
        parent->child = replacement;
    }

    item->next = NULL;
    item->prev = NULL;
    cJSON_Delete(item);

    return true;
}